

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O2

Vec_Ptr_t * Nwk_ManRetimeCutForward(Nwk_Man_t *pMan,int nLatches,int fVerbose)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  void *pvVar5;
  Nwk_Obj_t *pNVar6;
  Vec_Ptr_t *p;
  long *Entry;
  abctime aVar7;
  int iVar8;
  uint uVar9;
  
  aVar4 = Abc_Clock();
  pMan->nLatches = nLatches;
  uVar1 = *(undefined8 *)(pMan->nObjs + 1);
  pMan->nTruePis = (int)uVar1 - nLatches;
  pMan->nTruePos = (int)((ulong)uVar1 >> 0x20) - nLatches;
  for (iVar8 = 0; iVar8 < pMan->vCos->nSize; iVar8 = iVar8 + 1) {
    pvVar5 = Vec_PtrEntry(pMan->vCos,iVar8);
    *(byte *)((long)pvVar5 + 0x20) = *(byte *)((long)pvVar5 + 0x20) | 0x10;
  }
  for (iVar8 = 0; iVar8 < pMan->nTruePis; iVar8 = iVar8 + 1) {
    pNVar6 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCis,iVar8);
    Nwk_ManMarkTfoCone_rec(pNVar6);
  }
  Nwk_ManIncrementTravIdFlow(pMan);
  uVar9 = 0;
  for (iVar8 = 0; iVar8 < pMan->nLatches; iVar8 = iVar8 + 1) {
    pNVar6 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCis,pMan->nTruePis + iVar8);
    iVar2 = Nwk_ManPushForwardFast_rec(pNVar6,(Nwk_Obj_t *)0x0);
    if (iVar2 != 0) {
      Nwk_ManIncrementTravIdFlow(pMan);
      uVar9 = uVar9 + 1;
    }
  }
  if (fVerbose != 0) {
    printf("Forward:  Max-flow = %4d -> ",(ulong)uVar9);
  }
  Nwk_ManIncrementTravIdFlow(pMan);
  iVar2 = 0;
  for (iVar8 = 0; iVar8 < pMan->nLatches; iVar8 = iVar8 + 1) {
    pNVar6 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCis,pMan->nTruePis + iVar8);
    iVar3 = Nwk_ManPushForwardBot_rec(pNVar6,(Nwk_Obj_t *)0x0);
    if (iVar3 != 0) {
      Nwk_ManIncrementTravIdFlow(pMan);
      iVar2 = iVar2 + 1;
    }
  }
  if (fVerbose != 0) {
    printf("%4d.  ",(ulong)(iVar2 + uVar9));
  }
  if (0 < iVar2) {
    Nwk_ManIncrementTravIdFlow(pMan);
    iVar8 = 0;
    while (iVar8 < pMan->nLatches) {
      pNVar6 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCis,pMan->nTruePis + iVar8);
      iVar3 = Nwk_ManPushForwardBot_rec(pNVar6,(Nwk_Obj_t *)0x0);
      iVar8 = iVar8 + 1;
      if (iVar3 != 0) {
        __assert_fail("!RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                      ,0x1e6,"Vec_Ptr_t *Nwk_ManRetimeCutForward(Nwk_Man_t *, int, int)");
      }
    }
  }
  p = Vec_PtrAlloc(iVar2 + uVar9);
  iVar8 = 0;
  uVar9 = 0;
  do {
    if (pMan->vObjs->nSize <= iVar8) {
      Nwk_ManCleanMarks(pMan);
      if (fVerbose != 0) {
        iVar8 = 0x899ef6;
        printf("Min-cut = %4d.  Unmoved = %4d. ",(ulong)(uint)p->nSize,(ulong)uVar9);
        Abc_Print(iVar8,"%s =","Time");
        aVar7 = Abc_Clock();
        Abc_Print(iVar8,"%9.2f sec\n",(double)(aVar7 - aVar4) / 1000000.0);
      }
      return p;
    }
    Entry = (long *)Vec_PtrEntry(pMan->vObjs,iVar8);
    if ((Entry != (long *)0x0) && ((int)Entry[5] == *(int *)(*Entry + 0x68) + -2)) {
      if ((*(uint *)(Entry + 4) & 0x20) == 0) {
        __assert_fail("Nwk_ObjHasFlow(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                      ,0x1f0,"Vec_Ptr_t *Nwk_ManRetimeCutForward(Nwk_Man_t *, int, int)");
      }
      if ((*(uint *)(Entry + 4) & 7) == 2) {
        __assert_fail("!Nwk_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                      ,0x1f1,"Vec_Ptr_t *Nwk_ManRetimeCutForward(Nwk_Man_t *, int, int)");
      }
      Vec_PtrPush(p,Entry);
      uVar9 = uVar9 + ((*(uint *)(Entry + 4) & 7) == 1);
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Nwk_ManRetimeCutForward( Nwk_Man_t * pMan, int nLatches, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i, RetValue, Counter = 0, Counter2 = 0;
    abctime clk = Abc_Clock();
    // set the sequential parameters
    pMan->nLatches = nLatches;
    pMan->nTruePis = Nwk_ManCiNum(pMan) - nLatches;
    pMan->nTruePos = Nwk_ManCoNum(pMan) - nLatches;
    // mark the COs and the TFO of PIs
    Nwk_ManForEachCo( pMan, pObj, i )
        pObj->MarkA = 1;
    Nwk_ManForEachPiSeq( pMan, pObj, i )
        Nwk_ManMarkTfoCone_rec( pObj );
    // start flow computation from each LO
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLoSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushForwardFast_rec( pObj, NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter++;
    }
    if ( fVerbose )
    printf( "Forward:  Max-flow = %4d -> ", Counter );
    // continue flow computation from each LO
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLoSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushForwardBot_rec( pObj, NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter2++;
    }
    if ( fVerbose )
    printf( "%4d.  ", Counter+Counter2 );
    // repeat flow computation from each LO
    if ( Counter2 > 0 )
    {
        Nwk_ManIncrementTravIdFlow( pMan );
        Nwk_ManForEachLoSeq( pMan, pObj, i )
        {
            RetValue = Nwk_ManPushForwardBot_rec( pObj, NULL );
            assert( !RetValue );
        }
    }
    // cut is a set of nodes whose bottom is visited but top is not visited
    vNodes = Vec_PtrAlloc( Counter+Counter2 );
    Counter = 0;
    Nwk_ManForEachObj( pMan, pObj, i )
    {
        if ( Nwk_ObjVisitedBotOnly(pObj) )
        {
            assert( Nwk_ObjHasFlow(pObj) );
            assert( !Nwk_ObjIsCo(pObj) );
            Vec_PtrPush( vNodes, pObj );
            Counter += Nwk_ObjIsCi(pObj);
        }
    }
    Nwk_ManCleanMarks( pMan );
//    assert( Nwk_ManRetimeVerifyCutForward(pMan, vNodes) );
    if ( fVerbose )
    {
    printf( "Min-cut = %4d.  Unmoved = %4d. ", Vec_PtrSize(vNodes), Counter );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return vNodes;
}